

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O0

LinearFunctionalConstraint * __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ExtractLinAndExprArgs
          (Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,LinTerms *ltin,LinTerms *ltout)

{
  LinTerms *in_RDX;
  AffineExpr *in_RSI;
  LinearFunctionalConstraint *in_RDI;
  LinTerms lt_in_expr;
  LinearFunctionalConstraint *bt;
  AlgebraicExpression<mp::LinTerms> *in_stack_fffffffffffffe70;
  LinTerms *in_stack_ffffffffffffff28;
  LinTerms *in_stack_ffffffffffffff30;
  Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_ffffffffffffff38;
  
  bt = in_RDI;
  LinTerms::GetLinTerms(in_RDX);
  SplitLinTerms(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  LinTerms::LinTerms((LinTerms *)in_RDI,&in_RSI->super_LinTerms);
  AlgebraicExpression<mp::LinTerms>::AlgebraicExpression
            (in_stack_fffffffffffffe70,(LinTerms *)bt,(double)in_RDI);
  LinearFunctionalConstraint::LinearFunctionalConstraint(in_RDI,in_RSI);
  AlgebraicExpression<mp::LinTerms>::~AlgebraicExpression
            ((AlgebraicExpression<mp::LinTerms> *)0x1ac2af);
  LinTerms::~LinTerms((LinTerms *)in_RDI);
  LinTerms::~LinTerms((LinTerms *)in_RDI);
  return bt;
}

Assistant:

LinearFunctionalConstraint ExtractLinAndExprArgs(
      const LinTerms& ltin,
      LinTerms& ltout) {
    LinTerms lt_in_expr = SplitLinTerms(ltin.GetLinTerms(), ltout);
    return {{std::move(lt_in_expr), 0.0}};
  }